

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.cpp
# Opt level: O0

void anon_unknown.dwarf_1b9577::sha512::Transform(uint64_t *s,uchar *chunk)

{
  long in_FS_OFFSET;
  uint64_t uVar1;
  uint64_t uVar2;
  uchar *in_stack_ffffffffffffedd0;
  uint64_t *puVar3;
  uint64_t *puVar4;
  uint64_t *puVar5;
  uint64_t *puVar6;
  uint64_t *ptr;
  uint64_t *ptr_00;
  uint64_t *ptr_01;
  uint64_t *ptr_02;
  uint64_t *ptr_03;
  uint64_t f_00;
  uint64_t e_00;
  uint64_t *d_00;
  uint64_t c_00;
  uint64_t b_00;
  uint64_t a_00;
  uint64_t in_stack_ffffffffffffee30;
  uint64_t g_00;
  uint64_t *in_stack_ffffffffffffee38;
  uint64_t *h_00;
  uint64_t in_stack_ffffffffffffee40;
  uint64_t k;
  uint64_t in_stack_ffffffffffffee48;
  uint64_t w;
  uint64_t w15;
  uint64_t w14;
  uint64_t w13;
  uint64_t w12;
  uint64_t w11;
  uint64_t w10;
  uint64_t w9;
  uint64_t w8;
  uint64_t w7;
  uint64_t w6;
  uint64_t w5;
  uint64_t w4;
  uint64_t w3;
  uint64_t w2;
  uint64_t w1;
  uint64_t w0;
  uchar *chunk_local;
  uint64_t *s_local;
  uint64_t h;
  uint64_t g;
  uint64_t f;
  uint64_t e;
  uint64_t d;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  e_00 = *s;
  d_00 = (uint64_t *)s[1];
  c_00 = s[2];
  d = s[3];
  b_00 = s[4];
  a_00 = s[5];
  f_00 = s[6];
  h = s[7];
  g = f_00;
  f = a_00;
  e = b_00;
  c = c_00;
  b = (uint64_t)d_00;
  a = e_00;
  ReadBE64(in_stack_ffffffffffffedd0);
  ptr_00 = &h;
  ptr_01 = &d;
  puVar3 = ptr_00;
  Round(a_00,b_00,c_00,d_00,e_00,f_00,in_stack_ffffffffffffee30,in_stack_ffffffffffffee38,
        in_stack_ffffffffffffee40,in_stack_ffffffffffffee48);
  g_00 = a;
  h_00 = (uint64_t *)b;
  k = d;
  w = e;
  ReadBE64((uchar *)puVar3);
  puVar3 = &g;
  ptr_02 = &c;
  puVar4 = puVar3;
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  ReadBE64((uchar *)puVar4);
  puVar4 = &f;
  ptr_03 = &b;
  puVar5 = puVar4;
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  ReadBE64((uchar *)puVar5);
  puVar5 = &e;
  ptr = &a;
  puVar6 = puVar5;
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  ReadBE64((uchar *)puVar6);
  puVar6 = ptr_01;
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  ReadBE64((uchar *)puVar6);
  puVar6 = ptr_02;
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  ReadBE64((uchar *)puVar6);
  puVar6 = ptr_03;
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  ReadBE64((uchar *)puVar6);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  ReadBE64((uchar *)ptr);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  ReadBE64((uchar *)ptr_00);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  ReadBE64((uchar *)puVar3);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  ReadBE64((uchar *)puVar4);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  ReadBE64((uchar *)puVar5);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  ReadBE64((uchar *)ptr_01);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  ReadBE64((uchar *)ptr_02);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = h;
  ReadBE64((uchar *)ptr_03);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = g;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = f;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = e;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = d;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = c;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = b;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = a;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = h;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = g;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = f;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = e;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = d;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = c;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = b;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = a;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = h;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = g;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = f;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = e;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = d;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = c;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = b;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = a;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = h;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = g;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = f;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = e;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = d;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = c;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = b;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = a;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = h;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = g;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = f;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = e;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = d;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = c;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = b;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = a;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = h;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = g;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = f;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = e;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = d;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = c;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = b;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = a;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = h;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = g;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = f;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = e;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = d;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = c;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = b;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = a;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = h;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = g;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = f;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = e;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = d;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = c;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar1 = b;
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  uVar2 = a;
  sigma1(uVar1);
  sigma0(uVar1);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  sigma1(uVar2);
  sigma0(uVar2);
  Round(a_00,b_00,c_00,d_00,e_00,f_00,g_00,h_00,k,w);
  *s = *s + a;
  s[1] = s[1] + b;
  s[2] = s[2] + c;
  s[3] = s[3] + d;
  s[4] = s[4] + e;
  s[5] = s[5] + f;
  s[6] = s[6] + g;
  s[7] = s[7] + h;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Transform(uint64_t* s, const unsigned char* chunk)
{
    uint64_t a = s[0], b = s[1], c = s[2], d = s[3], e = s[4], f = s[5], g = s[6], h = s[7];
    uint64_t w0, w1, w2, w3, w4, w5, w6, w7, w8, w9, w10, w11, w12, w13, w14, w15;

    Round(a, b, c, d, e, f, g, h, 0x428a2f98d728ae22ull, w0 = ReadBE64(chunk + 0));
    Round(h, a, b, c, d, e, f, g, 0x7137449123ef65cdull, w1 = ReadBE64(chunk + 8));
    Round(g, h, a, b, c, d, e, f, 0xb5c0fbcfec4d3b2full, w2 = ReadBE64(chunk + 16));
    Round(f, g, h, a, b, c, d, e, 0xe9b5dba58189dbbcull, w3 = ReadBE64(chunk + 24));
    Round(e, f, g, h, a, b, c, d, 0x3956c25bf348b538ull, w4 = ReadBE64(chunk + 32));
    Round(d, e, f, g, h, a, b, c, 0x59f111f1b605d019ull, w5 = ReadBE64(chunk + 40));
    Round(c, d, e, f, g, h, a, b, 0x923f82a4af194f9bull, w6 = ReadBE64(chunk + 48));
    Round(b, c, d, e, f, g, h, a, 0xab1c5ed5da6d8118ull, w7 = ReadBE64(chunk + 56));
    Round(a, b, c, d, e, f, g, h, 0xd807aa98a3030242ull, w8 = ReadBE64(chunk + 64));
    Round(h, a, b, c, d, e, f, g, 0x12835b0145706fbeull, w9 = ReadBE64(chunk + 72));
    Round(g, h, a, b, c, d, e, f, 0x243185be4ee4b28cull, w10 = ReadBE64(chunk + 80));
    Round(f, g, h, a, b, c, d, e, 0x550c7dc3d5ffb4e2ull, w11 = ReadBE64(chunk + 88));
    Round(e, f, g, h, a, b, c, d, 0x72be5d74f27b896full, w12 = ReadBE64(chunk + 96));
    Round(d, e, f, g, h, a, b, c, 0x80deb1fe3b1696b1ull, w13 = ReadBE64(chunk + 104));
    Round(c, d, e, f, g, h, a, b, 0x9bdc06a725c71235ull, w14 = ReadBE64(chunk + 112));
    Round(b, c, d, e, f, g, h, a, 0xc19bf174cf692694ull, w15 = ReadBE64(chunk + 120));

    Round(a, b, c, d, e, f, g, h, 0xe49b69c19ef14ad2ull, w0 += sigma1(w14) + w9 + sigma0(w1));
    Round(h, a, b, c, d, e, f, g, 0xefbe4786384f25e3ull, w1 += sigma1(w15) + w10 + sigma0(w2));
    Round(g, h, a, b, c, d, e, f, 0x0fc19dc68b8cd5b5ull, w2 += sigma1(w0) + w11 + sigma0(w3));
    Round(f, g, h, a, b, c, d, e, 0x240ca1cc77ac9c65ull, w3 += sigma1(w1) + w12 + sigma0(w4));
    Round(e, f, g, h, a, b, c, d, 0x2de92c6f592b0275ull, w4 += sigma1(w2) + w13 + sigma0(w5));
    Round(d, e, f, g, h, a, b, c, 0x4a7484aa6ea6e483ull, w5 += sigma1(w3) + w14 + sigma0(w6));
    Round(c, d, e, f, g, h, a, b, 0x5cb0a9dcbd41fbd4ull, w6 += sigma1(w4) + w15 + sigma0(w7));
    Round(b, c, d, e, f, g, h, a, 0x76f988da831153b5ull, w7 += sigma1(w5) + w0 + sigma0(w8));
    Round(a, b, c, d, e, f, g, h, 0x983e5152ee66dfabull, w8 += sigma1(w6) + w1 + sigma0(w9));
    Round(h, a, b, c, d, e, f, g, 0xa831c66d2db43210ull, w9 += sigma1(w7) + w2 + sigma0(w10));
    Round(g, h, a, b, c, d, e, f, 0xb00327c898fb213full, w10 += sigma1(w8) + w3 + sigma0(w11));
    Round(f, g, h, a, b, c, d, e, 0xbf597fc7beef0ee4ull, w11 += sigma1(w9) + w4 + sigma0(w12));
    Round(e, f, g, h, a, b, c, d, 0xc6e00bf33da88fc2ull, w12 += sigma1(w10) + w5 + sigma0(w13));
    Round(d, e, f, g, h, a, b, c, 0xd5a79147930aa725ull, w13 += sigma1(w11) + w6 + sigma0(w14));
    Round(c, d, e, f, g, h, a, b, 0x06ca6351e003826full, w14 += sigma1(w12) + w7 + sigma0(w15));
    Round(b, c, d, e, f, g, h, a, 0x142929670a0e6e70ull, w15 += sigma1(w13) + w8 + sigma0(w0));

    Round(a, b, c, d, e, f, g, h, 0x27b70a8546d22ffcull, w0 += sigma1(w14) + w9 + sigma0(w1));
    Round(h, a, b, c, d, e, f, g, 0x2e1b21385c26c926ull, w1 += sigma1(w15) + w10 + sigma0(w2));
    Round(g, h, a, b, c, d, e, f, 0x4d2c6dfc5ac42aedull, w2 += sigma1(w0) + w11 + sigma0(w3));
    Round(f, g, h, a, b, c, d, e, 0x53380d139d95b3dfull, w3 += sigma1(w1) + w12 + sigma0(w4));
    Round(e, f, g, h, a, b, c, d, 0x650a73548baf63deull, w4 += sigma1(w2) + w13 + sigma0(w5));
    Round(d, e, f, g, h, a, b, c, 0x766a0abb3c77b2a8ull, w5 += sigma1(w3) + w14 + sigma0(w6));
    Round(c, d, e, f, g, h, a, b, 0x81c2c92e47edaee6ull, w6 += sigma1(w4) + w15 + sigma0(w7));
    Round(b, c, d, e, f, g, h, a, 0x92722c851482353bull, w7 += sigma1(w5) + w0 + sigma0(w8));
    Round(a, b, c, d, e, f, g, h, 0xa2bfe8a14cf10364ull, w8 += sigma1(w6) + w1 + sigma0(w9));
    Round(h, a, b, c, d, e, f, g, 0xa81a664bbc423001ull, w9 += sigma1(w7) + w2 + sigma0(w10));
    Round(g, h, a, b, c, d, e, f, 0xc24b8b70d0f89791ull, w10 += sigma1(w8) + w3 + sigma0(w11));
    Round(f, g, h, a, b, c, d, e, 0xc76c51a30654be30ull, w11 += sigma1(w9) + w4 + sigma0(w12));
    Round(e, f, g, h, a, b, c, d, 0xd192e819d6ef5218ull, w12 += sigma1(w10) + w5 + sigma0(w13));
    Round(d, e, f, g, h, a, b, c, 0xd69906245565a910ull, w13 += sigma1(w11) + w6 + sigma0(w14));
    Round(c, d, e, f, g, h, a, b, 0xf40e35855771202aull, w14 += sigma1(w12) + w7 + sigma0(w15));
    Round(b, c, d, e, f, g, h, a, 0x106aa07032bbd1b8ull, w15 += sigma1(w13) + w8 + sigma0(w0));

    Round(a, b, c, d, e, f, g, h, 0x19a4c116b8d2d0c8ull, w0 += sigma1(w14) + w9 + sigma0(w1));
    Round(h, a, b, c, d, e, f, g, 0x1e376c085141ab53ull, w1 += sigma1(w15) + w10 + sigma0(w2));
    Round(g, h, a, b, c, d, e, f, 0x2748774cdf8eeb99ull, w2 += sigma1(w0) + w11 + sigma0(w3));
    Round(f, g, h, a, b, c, d, e, 0x34b0bcb5e19b48a8ull, w3 += sigma1(w1) + w12 + sigma0(w4));
    Round(e, f, g, h, a, b, c, d, 0x391c0cb3c5c95a63ull, w4 += sigma1(w2) + w13 + sigma0(w5));
    Round(d, e, f, g, h, a, b, c, 0x4ed8aa4ae3418acbull, w5 += sigma1(w3) + w14 + sigma0(w6));
    Round(c, d, e, f, g, h, a, b, 0x5b9cca4f7763e373ull, w6 += sigma1(w4) + w15 + sigma0(w7));
    Round(b, c, d, e, f, g, h, a, 0x682e6ff3d6b2b8a3ull, w7 += sigma1(w5) + w0 + sigma0(w8));
    Round(a, b, c, d, e, f, g, h, 0x748f82ee5defb2fcull, w8 += sigma1(w6) + w1 + sigma0(w9));
    Round(h, a, b, c, d, e, f, g, 0x78a5636f43172f60ull, w9 += sigma1(w7) + w2 + sigma0(w10));
    Round(g, h, a, b, c, d, e, f, 0x84c87814a1f0ab72ull, w10 += sigma1(w8) + w3 + sigma0(w11));
    Round(f, g, h, a, b, c, d, e, 0x8cc702081a6439ecull, w11 += sigma1(w9) + w4 + sigma0(w12));
    Round(e, f, g, h, a, b, c, d, 0x90befffa23631e28ull, w12 += sigma1(w10) + w5 + sigma0(w13));
    Round(d, e, f, g, h, a, b, c, 0xa4506cebde82bde9ull, w13 += sigma1(w11) + w6 + sigma0(w14));
    Round(c, d, e, f, g, h, a, b, 0xbef9a3f7b2c67915ull, w14 += sigma1(w12) + w7 + sigma0(w15));
    Round(b, c, d, e, f, g, h, a, 0xc67178f2e372532bull, w15 += sigma1(w13) + w8 + sigma0(w0));

    Round(a, b, c, d, e, f, g, h, 0xca273eceea26619cull, w0 += sigma1(w14) + w9 + sigma0(w1));
    Round(h, a, b, c, d, e, f, g, 0xd186b8c721c0c207ull, w1 += sigma1(w15) + w10 + sigma0(w2));
    Round(g, h, a, b, c, d, e, f, 0xeada7dd6cde0eb1eull, w2 += sigma1(w0) + w11 + sigma0(w3));
    Round(f, g, h, a, b, c, d, e, 0xf57d4f7fee6ed178ull, w3 += sigma1(w1) + w12 + sigma0(w4));
    Round(e, f, g, h, a, b, c, d, 0x06f067aa72176fbaull, w4 += sigma1(w2) + w13 + sigma0(w5));
    Round(d, e, f, g, h, a, b, c, 0x0a637dc5a2c898a6ull, w5 += sigma1(w3) + w14 + sigma0(w6));
    Round(c, d, e, f, g, h, a, b, 0x113f9804bef90daeull, w6 += sigma1(w4) + w15 + sigma0(w7));
    Round(b, c, d, e, f, g, h, a, 0x1b710b35131c471bull, w7 += sigma1(w5) + w0 + sigma0(w8));
    Round(a, b, c, d, e, f, g, h, 0x28db77f523047d84ull, w8 += sigma1(w6) + w1 + sigma0(w9));
    Round(h, a, b, c, d, e, f, g, 0x32caab7b40c72493ull, w9 += sigma1(w7) + w2 + sigma0(w10));
    Round(g, h, a, b, c, d, e, f, 0x3c9ebe0a15c9bebcull, w10 += sigma1(w8) + w3 + sigma0(w11));
    Round(f, g, h, a, b, c, d, e, 0x431d67c49c100d4cull, w11 += sigma1(w9) + w4 + sigma0(w12));
    Round(e, f, g, h, a, b, c, d, 0x4cc5d4becb3e42b6ull, w12 += sigma1(w10) + w5 + sigma0(w13));
    Round(d, e, f, g, h, a, b, c, 0x597f299cfc657e2aull, w13 += sigma1(w11) + w6 + sigma0(w14));
    Round(c, d, e, f, g, h, a, b, 0x5fcb6fab3ad6faecull, w14 + sigma1(w12) + w7 + sigma0(w15));
    Round(b, c, d, e, f, g, h, a, 0x6c44198c4a475817ull, w15 + sigma1(w13) + w8 + sigma0(w0));

    s[0] += a;
    s[1] += b;
    s[2] += c;
    s[3] += d;
    s[4] += e;
    s[5] += f;
    s[6] += g;
    s[7] += h;
}